

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_min_s_h_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  short sVar4;
  short sVar5;
  
  lVar1 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  sVar4 = (short)(env->active_fpu).fpr[ws].fs[0];
  sVar5 = (short)(env->active_fpu).fpr[wt].fs[0];
  if (sVar4 < sVar5) {
    sVar5 = sVar4;
  }
  *(short *)((env->active_fpu).fpr + wd) = sVar5;
  sVar5 = *(short *)((long)(env->active_fpu).fpr + lVar3 + 2);
  sVar4 = *(short *)((long)(env->active_fpu).fpr + lVar2 + 2);
  if (sVar5 < sVar4) {
    sVar4 = sVar5;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 2) = sVar4;
  sVar4 = (short)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 4);
  sVar5 = (short)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 4);
  if (sVar4 < sVar5) {
    sVar5 = sVar4;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 4) = sVar5;
  sVar5 = *(short *)((long)(env->active_fpu).fpr + lVar3 + 6);
  sVar4 = *(short *)((long)(env->active_fpu).fpr + lVar2 + 6);
  if (sVar5 < sVar4) {
    sVar4 = sVar5;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 6) = sVar4;
  sVar4 = (short)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 8);
  sVar5 = (short)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 8);
  if (sVar4 < sVar5) {
    sVar5 = sVar4;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 8) = sVar5;
  sVar5 = *(short *)((long)(env->active_fpu).fpr + lVar3 + 10);
  sVar4 = *(short *)((long)(env->active_fpu).fpr + lVar2 + 10);
  if (sVar5 < sVar4) {
    sVar4 = sVar5;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 10) = sVar4;
  sVar4 = (short)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  sVar5 = (short)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 0xc);
  if (sVar4 < sVar5) {
    sVar5 = sVar4;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 0xc) = sVar5;
  sVar5 = *(short *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  sVar4 = *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xe);
  if (sVar5 < sVar4) {
    sVar4 = sVar5;
  }
  *(short *)((long)(env->active_fpu).fpr + lVar1 + 0xe) = sVar4;
  return;
}

Assistant:

void helper_msa_min_s_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_min_s_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_min_s_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_min_s_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_min_s_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_min_s_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_min_s_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_min_s_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_min_s_df(DF_HALF, pws->h[7],  pwt->h[7]);
}